

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean.c
# Opt level: O0

BoolExpr * BO_and(List *ls)

{
  bool bVar1;
  ListStruct *pLVar2;
  BOOL hit_true;
  BoolExpr *ret;
  BoolExpr *subexpr;
  List *ls_local;
  
  bVar1 = false;
  ls_local = (List *)create_bool_expr(E_AND,(BoolExpr *)0x0);
  subexpr = (BoolExpr *)ls;
  while( true ) {
    subexpr = *(BoolExpr **)subexpr;
    if ((List *)subexpr == (List *)0x0) {
      if (ls_local->car == (ListStruct *)0x0) {
        if (bVar1) {
          ls_local = (List *)&true_bool_expr;
        }
        else {
          parse_error((List *)0x0,"and takes arguments!\n");
          ls_local = (List *)&false_bool_expr;
        }
      }
      else if (*(BoolExprStruct **)&ls_local->car->token == (BoolExprStruct *)0x0) {
        ls_local = ls_local->car;
      }
      return (BoolExpr *)ls_local;
    }
    pLVar2 = (ListStruct *)make_boolean_expr((List *)subexpr);
    if (*(BoolExprType *)&pLVar2->cdr == E_FALSE) break;
    if (*(BoolExprType *)&pLVar2->cdr == E_TRUE) {
      bVar1 = true;
    }
    else {
      *(ListStruct **)&pLVar2->token = ls_local->car;
      ls_local->car = pLVar2;
    }
  }
  ls_local = (List *)&false_bool_expr;
  return (BoolExpr *)ls_local;
}

Assistant:

static BoolExpr *
BO_and(const List *ls)
{
  BoolExpr *subexpr, *ret;
  BOOL hit_true = FALSE;

  ret = create_bool_expr (E_AND, NULL);
  while ((ls = ls->cdr))
    {
      subexpr = make_boolean_expr (ls);
      if (subexpr->type == E_FALSE)  /* If we ever hit FALSE, expr is FALSE */
	return &false_bool_expr;
      if (subexpr->type != E_TRUE)   /* No sense adding in TRUE statements */
	{
	  subexpr->next = ret->subexpr;
	  ret->subexpr = subexpr;
	}
      else hit_true = TRUE;
    }
  if (ret->subexpr == NULL)
    {
      if (hit_true)   /* If we hit nothing but TRUE's return TRUE */
	return &true_bool_expr;
      parse_error(ls, "and takes arguments!\n");
      return &false_bool_expr;  /* default = FALSE */
    }
  
  if (ret->subexpr->next == NULL) /* (and a) == a */
    return ret->subexpr;   
  
  return ret;
}